

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<long_double>::Subst_Forward
          (TPZSkylMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  long lVar1;
  longdouble lVar2;
  long lVar3;
  longdouble *plVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  longdouble **pplVar7;
  longdouble *plVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  longdouble *plVar12;
  longdouble lVar13;
  long local_58;
  long local_50;
  undefined4 extraout_var_00;
  
  lVar6 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar6 != CONCAT44(extraout_var,iVar5)) ||
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<long_double>::Error
              ("virtual int TPZSkylMatrix<long double>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = long double]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar5 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar6 = CONCAT44(extraout_var_00,iVar5);
  if (0 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
    local_50 = 0;
    local_58 = 0;
    do {
      if (lVar6 < 1) {
        lVar10 = 0;
LAB_00cc6053:
        if (lVar10 < lVar6) {
          pplVar7 = (this->fElem).fStore;
          lVar3 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          lVar11 = lVar10 * 0x10 + -0x10;
          do {
            if ((lVar3 <= lVar10) ||
               ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_58)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            plVar4 = B->fElem;
            plVar12 = pplVar7[lVar10] + 1;
            lVar13 = (longdouble)0;
            if (plVar12 < pplVar7[lVar10 + 1]) {
              plVar8 = (longdouble *)(local_50 * lVar3 + lVar11 + (long)plVar4);
              lVar13 = (longdouble)0;
              do {
                lVar13 = *plVar8 * *plVar12 + lVar13;
                plVar12 = plVar12 + 1;
                plVar8 = plVar8 + -1;
              } while (plVar12 < pplVar7[lVar10 + 1]);
            }
            if ((lVar3 <= lVar10) ||
               ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_58)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = lVar3 * local_58;
            lVar2 = plVar4[lVar9 + lVar10];
            plVar4[lVar9 + lVar10] = lVar2 - lVar13;
            pplVar7 = (this->fElem).fStore;
            lVar1 = lVar10 + 1;
            plVar4[lVar9 + lVar10] = (lVar2 - lVar13) / *pplVar7[lVar10];
            lVar11 = lVar11 + 0x10;
            lVar10 = lVar1;
          } while (lVar1 != lVar6);
        }
      }
      else {
        lVar3 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        lVar11 = 0;
        lVar10 = 0;
        do {
          if ((lVar3 <= lVar10) ||
             ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_58)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar13 = *(longdouble *)((long)B->fElem + lVar11 + local_50 * lVar3);
          if ((lVar13 != (longdouble)0) || (NAN(lVar13) || NAN((longdouble)0))) goto LAB_00cc6053;
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x10;
        } while (lVar6 != lVar10);
      }
      local_58 = local_58 + 1;
      local_50 = local_50 + 0x10;
    } while (local_58 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}